

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::EnumValueDescriptorProto::ByteSizeLong(EnumValueDescriptorProto *this)

{
  bool bVar1;
  int32 value;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  string *value_00;
  size_t sVar3;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  EnumValueDescriptorProto *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = EnumValueDescriptorProto::unknown_fields(this);
    sStack_38 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      value_00 = name_abi_cxx11_(this);
      sVar3 = internal::WireFormatLite::StringSize(value_00);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      sVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumValueOptions>
                        (this->options_);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_number(this);
    if (bVar1) {
      value = number(this);
      sVar3 = internal::WireFormatLite::Int32Size(value);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
  }
  iVar2 = internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t EnumValueDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumValueDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.EnumValueOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

    // optional int32 number = 2;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}